

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec3 djb::normalize(vec3 *v)

{
  float fVar1;
  vec3 vVar2;
  
  fVar1 = v->z * v->z + v->x * v->x + v->y * v->y;
  if (0.0 < fVar1) {
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar1 = 1.0 / fVar1;
    vVar2.x = v->x * fVar1;
    vVar2.y = v->y * fVar1;
    vVar2.z = fVar1 * v->z;
    return vVar2;
  }
  __assert_fail("x > T(0)",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x259,"T djb::inversesqrt(const T &) [T = float]");
}

Assistant:

static float_t dot(const vec3 &a, const vec3 &b)
{
	return (a.x * b.x + a.y * b.y + a.z * b.z);
}